

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec.c
# Opt level: O0

axbStatus_t axbVecCopy(axbVec_s *x,axbVec_s *y)

{
  _func_axbStatus_t_axbVec_s_ptr_axbVec_s_ptr_void_ptr *op;
  axbOpDescriptor_t op_desc;
  axbVec_s *y_local;
  axbVec_s *x_local;
  
  op_desc._48_8_ = y;
  if (x->init == 0x1d232) {
    if (y->init == 0x1d232) {
      memcpy(&op,y->opBackend->op_table + 0xe,0x38);
      (*op)(x,(axbVec_s *)op_desc._48_8_,op_desc.func);
      x_local._4_4_ = 0;
    }
    else {
      fprintf(_stderr,"Vector not fully initialized!\n");
      x_local._4_4_ = 0x1d232;
    }
  }
  else {
    fprintf(_stderr,"Vector not fully initialized!\n");
    x_local._4_4_ = 0x1d232;
  }
  return x_local._4_4_;
}

Assistant:

axbStatus_t axbVecCopy(const struct axbVec_s *x, struct axbVec_s *y)
{
  AXB_VECTOR_INIT_CHECK(x);
  AXB_VECTOR_INIT_CHECK(y);

  axbOpDescriptor_t op_desc = y->opBackend->op_table[AXB_OP_VEC_COPY];
  axbStatus_t (*op)(const struct axbVec_s *, struct axbVec_s *, void*) = (axbStatus_t (*)(const struct axbVec_s *, struct axbVec_s *, void*)) op_desc.func;
  op(x, y, op_desc.func_data);
  return 0;
}